

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.hpp
# Opt level: O0

void __thiscall msgpack::v1::sbuffer::sbuffer(sbuffer *this,size_t initsz)

{
  void *pvVar1;
  bad_alloc *this_00;
  size_t in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[2] = in_RSI;
  if (in_RSI == 0) {
    in_RDI[1] = 0;
  }
  else {
    pvVar1 = malloc(in_RSI);
    in_RDI[1] = pvVar1;
    if (in_RDI[1] == 0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

sbuffer(size_t initsz = MSGPACK_SBUFFER_INIT_SIZE):m_size(0), m_alloc(initsz)
    {
        if(initsz == 0) {
            m_data = MSGPACK_NULLPTR;
        } else {
            m_data = (char*)::malloc(initsz);
            if(!m_data) {
                throw std::bad_alloc();
            }
        }
    }